

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.h
# Opt level: O0

void __thiscall BasePacketReader::read<unsigned_int>(BasePacketReader *this,uint *value)

{
  uint *value_local;
  BasePacketReader *this_local;
  
  if (this->mMaxLen < this->mPos + 4) {
    if (this->mMaxLen < this->mPos + 4) {
      __assert_fail("mPos + sizeof(value) <= mMaxLen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/utils/packet.h"
                    ,0x1d1,"void BasePacketReader::read(T &) [T = unsigned int]");
    }
  }
  else {
    *value = *(uint *)(this->mBuffer + this->mPos);
    this->mPos = this->mPos + 4;
  }
  return;
}

Assistant:

void            read(T& value)
    {
        static_assert(std::is_same < T, typename std::remove_pointer<T>::type>::value, "T must a nomal type");
        static_assert(std::is_pod <T>::value, "T must a pod type");

        if ((mPos + sizeof(value) <= mMaxLen))
        {
            value = *(T*)(mBuffer + mPos);
            mPos += sizeof(value);
        }
        else
        {
            assert(mPos + sizeof(value) <= mMaxLen);
        }
    }